

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O0

void __thiscall camp::UserObject::set(UserObject *this,Property *property,Value *value)

{
  bool bVar1;
  ParentObject *pPVar2;
  ParentObject *object;
  NullObject *__return_storage_ptr__;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [48];
  NullObject local_70;
  ParentObject *local_28;
  UserObject *root;
  Value *value_local;
  Property *property_local;
  UserObject *this_local;
  
  root = (UserObject *)value;
  value_local = (Value *)property;
  property_local = (Property *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_holder);
  if (bVar1) {
    (**(code **)(*(long *)&value_local->m_value + 0x20))(value_local,this,root);
  }
  else {
    bVar1 = boost::scoped_ptr::operator_cast_to_bool((scoped_ptr *)&this->m_parent);
    local_28 = (ParentObject *)this;
    if (!bVar1) {
      __return_storage_ptr__ = (NullObject *)__cxa_allocate_exception(0x48);
      NullObject::NullObject(&local_70,this->m_class);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/userobject.cpp"
                 ,&local_a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c8,"void camp::UserObject::set(const Property &, const Value &) const",
                 &local_c9);
      Error::prepare<camp::NullObject>
                (__return_storage_ptr__,&local_70,(string *)local_a0,0xd7,(string *)local_c8);
      __cxa_throw(__return_storage_ptr__,&NullObject::typeinfo,NullObject::~NullObject);
    }
    while( true ) {
      pPVar2 = boost::scoped_ptr<camp::ParentObject>::operator->(&(local_28->object).m_parent);
      bVar1 = boost::scoped_ptr::operator_cast_to_bool((scoped_ptr *)&(pPVar2->object).m_parent);
      pPVar2 = local_28;
      if (!bVar1) break;
      local_28 = boost::scoped_ptr<camp::ParentObject>::operator->(&(local_28->object).m_parent);
    }
    object = boost::scoped_ptr<camp::ParentObject>::operator->(&(local_28->object).m_parent);
    cascadeSet(&pPVar2->object,&object->object,(Property *)value_local,(Value *)root);
  }
  return;
}

Assistant:

void UserObject::set(const Property& property, const Value& value) const
{
    if (m_holder)
    {
        // Just forward to the property, no extra processing required
        property.setValue(*this, value);
    }
    else if (m_parent)
    {
        // Find the root object
        const UserObject* root = this;
        while (root->m_parent->object.m_parent)
            root = &root->m_parent->object;

        // Launch the recursive process
        root->cascadeSet(root->m_parent->object, property, value);
    }
    else
    {
        // Error, null object
        CAMP_ERROR(NullObject(m_class));
    }
}